

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

float __thiscall
MetaCommand::GetValueAsFloat(MetaCommand *this,string *optionName,string *fieldName)

{
  __type _Var1;
  pointer __lhs;
  pointer __lhs_00;
  float fVar2;
  double dVar3;
  string fieldname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)fieldName);
  if (fieldName->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_48);
  }
  __lhs_00 = (this->m_OptionVector).
             super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    if (__lhs_00 ==
        (this->m_OptionVector).
        super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      fVar2 = 0.0;
LAB_00116604:
      std::__cxx11::string::~string((string *)&local_48);
      return fVar2;
    }
    _Var1 = std::operator==(&__lhs_00->name,optionName);
    if (_Var1) {
      for (__lhs = (__lhs_00->fields).
                   super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          __lhs != (__lhs_00->fields).
                   super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
        _Var1 = std::operator==(&__lhs->name,&local_48);
        if (_Var1) {
          dVar3 = atof((__lhs->value)._M_dataplus._M_p);
          fVar2 = (float)dVar3;
          goto LAB_00116604;
        }
      }
    }
    __lhs_00 = __lhs_00 + 1;
  } while( true );
}

Assistant:

float MetaCommand::GetValueAsFloat(METAIO_STL::string optionName,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = optionName;
  }

  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if((*it).name == optionName)
      {
      auto itField = (*it).fields.begin();
      while(itField != (*it).fields.end())
        {
        if((*itField).name == fieldname)
          {
          return (float)atof((*itField).value.c_str());
          }
        ++itField;
        }
      }
    ++it;
    }
  return 0;
}